

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O1

void * __thiscall
MultiANN::NearestNeighbor(MultiANN *this,ANNpoint *x,int *best_idx,double *best_dist)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ANNpoint pAVar7;
  int iVar8;
  ANNpoint pAVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  double dVar13;
  double dVar14;
  double d;
  double local_80;
  double local_78;
  int *local_70;
  double *local_68;
  double local_60;
  double local_58;
  ulong uStack_50;
  double local_48;
  ulong uStack_40;
  
  local_78 = INFINITY;
  iVar8 = 0;
  uVar11 = 0x1f;
  local_70 = best_idx;
  local_68 = best_dist;
  do {
    if (this->AnnArray[uVar11 - 1] != (ANN *)0x0) {
      local_80 = 0.0;
      iVar8 = ANN::NearestNeighbor
                        (this->AnnArray[uVar11 - 1],this->topology,this->scaling,x,&local_80);
      if (local_80 < local_78) {
        *local_70 = iVar8;
        local_78 = local_80;
      }
      iVar8 = ANN::LastNode(this->AnnArray[uVar11 - 1]);
      iVar8 = (uint)(iVar8 != this->size) + iVar8;
    }
    uVar11 = uVar11 - 1;
  } while (4 < uVar11);
  if (iVar8 != this->size) {
    lVar12 = (long)iVar8;
    do {
      pAVar7 = this->points_coor[lVar12];
      local_80 = 0.0;
      if (0 < this->dimension) {
        iVar8 = 0;
        do {
          iVar10 = this->topology[iVar8];
          if (iVar10 == 3) {
            dVar13 = pAVar7[iVar8];
            pAVar9 = *x;
            dVar14 = pAVar9[iVar8];
            dVar1 = pAVar7[(long)iVar8 + 1];
            dVar2 = pAVar7[(long)iVar8 + 2];
            dVar3 = pAVar9[(long)iVar8 + 1];
            dVar4 = pAVar9[(long)iVar8 + 2];
            dVar5 = pAVar7[(long)iVar8 + 3];
            dVar6 = pAVar9[(long)iVar8 + 3];
            local_58 = dVar5 * dVar6 + dVar2 * dVar4 + dVar13 * dVar14 + dVar1 * dVar3;
            if (1.0 < local_58) {
              local_58 = local_58 /
                         ((dVar6 * dVar6 + dVar4 * dVar4 + dVar14 * dVar14 + dVar3 * dVar3) *
                         (dVar5 * dVar5 + dVar2 * dVar2 + dVar13 * dVar13 + dVar1 * dVar1));
            }
            uStack_50 = 0;
            iVar10 = iVar8 + 3;
            local_60 = acos(local_58);
            local_48 = -local_58;
            uStack_40 = uStack_50 ^ 0x8000000000000000;
            dVar13 = acos(local_48);
            dVar13 = acos((double)(~-(ulong)(dVar13 < local_60) & (ulong)local_58 |
                                  (ulong)local_48 & -(ulong)(dVar13 < local_60)));
            pAVar9 = this->scaling;
LAB_0010607d:
            local_80 = dVar13 * pAVar9[iVar8] * dVar13 * pAVar9[iVar8] + local_80;
            iVar8 = iVar10;
          }
          else if (iVar10 == 2) {
            dVar14 = ABS(pAVar7[iVar8] - (*x)[iVar8]);
            dVar13 = 6.283185307179586 - dVar14;
            if (dVar14 <= 6.283185307179586 - dVar14) {
              dVar13 = dVar14;
            }
            dVar13 = dVar13 * this->scaling[iVar8];
            local_80 = dVar13 * dVar13 + local_80;
          }
          else if (iVar10 == 1) {
            pAVar9 = this->scaling;
            dVar13 = pAVar7[iVar8] - (*x)[iVar8];
            iVar10 = iVar8;
            goto LAB_0010607d;
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 < this->dimension);
      }
      if (local_80 < 0.0) {
        local_80 = sqrt(local_80);
      }
      else {
        local_80 = SQRT(local_80);
      }
      if (local_80 < local_78) {
        *local_70 = (int)lVar12;
        local_78 = local_80;
      }
      lVar12 = lVar12 + 1;
    } while (this->size != (int)lVar12);
  }
  *local_68 = local_78;
  return this->points_ptr[*local_70];
}

Assistant:

void *MultiANN::NearestNeighbor(  // 1-nearest neighbor query
    const ANNpoint &x,            // query point
    int &best_idx,      // index of the nearest neighbor to x (returned)
    double &best_dist)  // distance from the nearest neighbor to x (returned)
{
    int n, n_last;
    int k;
    double d, d_min;

    n = n_last = 0;  // Keeps the warnings away
    d_min = INFINITY;
    d = 0.0;

    for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX;
         k--) {             // Find the nearest neighbor
        if (AnnArray[k]) {  // First check the ANN trees
            d = 0.0;
            n = AnnArray[k]->NearestNeighbor(topology, scaling, x, d);
            if (d < d_min) {
                d_min = d;
                best_idx = n;
            }
            n_last = AnnArray[k]->LastNode();
            if (n_last != size) n_last++;
        }
    }

    for (n = n_last; n != size;
         n++) {  // Check the new nodes, which are not yet in the ANN tree
        ANNpoint x1 = points_coor[n];
        d = 0.0;
        for (int i = 0; i < dimension; i++) {
            if (topology[i] == 1) {
                d += ANN_POW(scaling[i] * (x1[i] - x[i]));
            } else if (topology[i] == 2) {
                double t = fabs(x1[i] - x[i]);
                double t1 = ANN_MIN(t, 2.0 * PI - t);
                d += ANN_POW(scaling[i] * t1);
            } else if (topology[i] == 3) {
                double fd = x1[i] * x[i] + x1[i + 1] * x[i + 1] +
                            x1[i + 2] * x[i + 2] + x1[i + 3] * x[i + 3];
                if (fd > 1) {
                    double norm1 = x1[i] * x1[i] + x1[i + 1] * x1[i + 1] +
                                   x1[i + 2] * x1[i + 2] +
                                   x1[i + 3] * x1[i + 3];
                    double norm2 = x[i] * x[i] + x[i + 1] * x[i + 1] +
                                   x[i + 2] * x[i + 2] + x[i + 3] * x[i + 3];
                    fd = fd / (norm1 * norm2);
                }
                double dtheta = ANN_MIN(acos(fd), acos(-fd));
                d += ANN_POW(scaling[i] * dtheta);
                i = i + 3;
            }
        }
        d = sqrt(d);
        if (d < d_min) {
            d_min = d;
            best_idx = n;
        }
    }

    best_dist = d_min;
    return points_ptr[best_idx];
}